

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteTranslational::IntToDescriptor
          (ChLinkRevoluteTranslational *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,
          uint off_L,ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  int iVar1;
  CoeffReturnType pdVar2;
  undefined4 in_register_00000034;
  
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (this,CONCAT44(in_register_00000034,off_v));
  if ((char)iVar1 != '\0') {
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,(ulong)off_L
                       );
    (this->m_cnstr_par1).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 1));
    (this->m_cnstr_par2).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 2));
    (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 3));
    (this->m_cnstr_dist).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                        (ulong)off_L);
    (this->m_cnstr_par1).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                        (ulong)(off_L + 1));
    (this->m_cnstr_par2).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                        (ulong)(off_L + 2));
    (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                        (ulong)(off_L + 3));
    (this->m_cnstr_dist).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
  }
  return;
}

Assistant:

void ChLinkRevoluteTranslational::IntToDescriptor(const unsigned int off_v,
                                                  const ChStateDelta& v,
                                                  const ChVectorDynamic<>& R,
                                                  const unsigned int off_L,
                                                  const ChVectorDynamic<>& L,
                                                  const ChVectorDynamic<>& Qc) {
    if (!IsActive())
        return;

    m_cnstr_par1.Set_l_i(L(off_L + 0));
    m_cnstr_par2.Set_l_i(L(off_L + 1));
    m_cnstr_dot.Set_l_i(L(off_L + 2));
    m_cnstr_dist.Set_l_i(L(off_L + 3));

    m_cnstr_par1.Set_b_i(Qc(off_L + 0));
    m_cnstr_par2.Set_b_i(Qc(off_L + 1));
    m_cnstr_dot.Set_b_i(Qc(off_L + 2));
    m_cnstr_dist.Set_b_i(Qc(off_L + 3));
}